

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmm.c
# Opt level: O2

void hmm_clear_scores(hmm_t *h)

{
  byte bVar1;
  hmm_state_t *phVar2;
  ulong uVar3;
  
  h->state[0].score = -0x38000000;
  bVar1 = h->n_emit_state;
  phVar2 = h->state;
  for (uVar3 = 1; phVar2 = phVar2 + 1, uVar3 < bVar1; uVar3 = uVar3 + 1) {
    phVar2->score = -0x38000000;
  }
  (h->out).score = -0x38000000;
  h->bestscore = -0x38000000;
  return;
}

Assistant:

void
hmm_clear_scores(hmm_t * h)
{
    int32 i;

    hmm_in_score(h) = WORST_SCORE;
    for (i = 1; i < hmm_n_emit_state(h); i++)
        hmm_score(h, i) = WORST_SCORE;
    hmm_out_score(h) = WORST_SCORE;

    h->bestscore = WORST_SCORE;
}